

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusreply.h
# Opt level: O2

QDBusReply<QDBusObjectPath> * __thiscall
QDBusReply<QDBusObjectPath>::operator=(QDBusReply<QDBusObjectPath> *this,QDBusMessage *reply)

{
  qsizetype qVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_68;
  anon_union_24_3_e3d07ef4_for_data local_48;
  undefined8 uStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._16_8_ = 0xaaaaaaaaaaaaaaaa;
  uStack_30 = 0xaaaaaaaaaaaaaaaa;
  local_48.shared = (PrivateShared *)0xaaaaaaaaaaaaaaaa;
  local_48._8_8_ = 0xaaaaaaaaaaaaaaaa;
  QVariant::QVariant((QVariant *)&local_48,(QMetaType)0x129468,(void *)0x0);
  qDBusReplyFill(reply,&this->m_error,(QVariant *)&local_48);
  qvariant_cast<QDBusObjectPath>((QDBusObjectPath *)&local_68,(QVariant *)&local_48);
  pDVar2 = (this->m_data).m_path.d.d;
  pcVar3 = (this->m_data).m_path.d.ptr;
  (this->m_data).m_path.d.d = local_68.d;
  (this->m_data).m_path.d.ptr = local_68.ptr;
  qVar1 = (this->m_data).m_path.d.size;
  (this->m_data).m_path.d.size = local_68.size;
  local_68.d = pDVar2;
  local_68.ptr = pcVar3;
  local_68.size = qVar1;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  QVariant::~QVariant((QVariant *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

inline QDBusReply& operator=(const QDBusMessage &reply)
    {
        QVariant data(QMetaType::fromType<Type>());
        qDBusReplyFill(reply, m_error, data);
        m_data = qvariant_cast<Type>(data);
        return *this;
    }